

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateCompoundVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,int expandLevel)

{
  Node *ptr;
  TestNode *node;
  TestContext *testCtx;
  TestCaseGroup *blockGroup;
  undefined1 local_40 [8];
  SharedPtr structMember;
  int expandLevel_local;
  ProgramResourceQueryTestTarget *queryTarget_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  if (0 < expandLevel) {
    structMember.m_state._4_4_ = expandLevel;
    ptr = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)ptr,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_40,ptr);
    node = (TestNode *)operator_new(0x70);
    testCtx = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,"struct","Structs");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    generateVariableCases
              (context,(SharedPtr *)local_40,(TestCaseGroup *)node,queryTarget,
               structMember.m_state._4_4_,structMember.m_state._4_4_ != 1);
    generateOpaqueTypeCases
              (context,(SharedPtr *)local_40,(TestCaseGroup *)node,queryTarget,
               structMember.m_state._4_4_,structMember.m_state._4_4_ != 1);
    generateVariableArrayCases
              (context,(SharedPtr *)local_40,(TestCaseGroup *)node,queryTarget,
               structMember.m_state._4_4_ + -1);
    generateCompoundVariableCases
              (context,(SharedPtr *)local_40,(TestCaseGroup *)node,queryTarget,
               structMember.m_state._4_4_ + -1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_40);
  }
  return;
}

Assistant:

static void generateCompoundVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, int expandLevel)
{
	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		tcu::TestCaseGroup* const					blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), "struct", "Structs");

		targetGroup->addChild(blockGroup);

		// Struct containing basic variable
		generateVariableCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing opaque types
		generateOpaqueTypeCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing arrays
		generateVariableArrayCases(context, structMember, blockGroup, queryTarget, expandLevel-1);

		// Struct containing struct
		generateCompoundVariableCases(context, structMember, blockGroup, queryTarget, expandLevel-1);
	}
}